

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_json_reader<std::ifstream&>
          (basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          basic_ifstream<char,_std::char_traits<char>_> *source,basic_json_visitor<char> *visitor,
          allocator<char> *temp_alloc)

{
  _Any_data local_158;
  code *local_148;
  code *local_140;
  basic_json_decode_options<char> local_130;
  
  basic_json_decode_options<char>::basic_json_decode_options(&local_130);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
              ::_M_manager;
  basic_json_reader<std::ifstream&>
            (this,source,visitor,&local_130,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_158,
             temp_alloc);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  basic_json_decode_options<char>::~basic_json_decode_options(&local_130);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source, 
                          basic_json_visitor<CharT>& visitor, 
                          const TempAllocator& temp_alloc = TempAllocator())
            : basic_json_reader(std::forward<Sourceable>(source),
                                visitor,
                                basic_json_decode_options<CharT>(),
                                default_json_parsing(),
                                temp_alloc)
        {
        }